

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

void __thiscall cfd::CoinSelectionOption::InitializeTxSizeInfo(CoinSelectionOption *this)

{
  uint32_t uVar1;
  Script *in_RDI;
  TxOutReference txout_ref;
  TxOut txout;
  Script wpkh_script;
  Script local_160;
  AbstractTxOutReference local_128;
  Amount local_d8;
  TxOut local_c8;
  allocator local_61;
  string local_60;
  Script local_40;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_60,"0014ffffffffffffffffffffffffffffffffffffffff",&local_61);
  core::Script::Script(&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  core::Amount::Amount(&local_d8);
  core::TxOut::TxOut(&local_c8,&local_d8,&local_40);
  core::TxOutReference::TxOutReference((TxOutReference *)&local_128,&local_c8);
  uVar1 = core::AbstractTxOutReference::GetSerializeVsize(&local_128);
  *(uint32_t *)((long)&in_RDI->_vptr_Script + 4) = uVar1;
  core::Script::Script(&local_160);
  uVar1 = core::TxIn::EstimateTxInVsize(kP2wpkhAddress,&local_160,(Script *)0x0);
  *(uint32_t *)
   &(in_RDI->script_data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = uVar1;
  core::Script::~Script(in_RDI);
  core::TxOutReference::~TxOutReference((TxOutReference *)0x52c20b);
  core::TxOut::~TxOut((TxOut *)0x52c218);
  core::Script::~Script(in_RDI);
  return;
}

Assistant:

void CoinSelectionOption::InitializeTxSizeInfo() {
  // wpkh想定
  Script wpkh_script("0014ffffffffffffffffffffffffffffffffffffffff");
  TxOut txout(Amount(), wpkh_script);
  TxOutReference txout_ref(txout);
  change_output_size_ = txout_ref.GetSerializeVsize();
  change_spend_size_ =
      TxIn::EstimateTxInVsize(AddressType::kP2wpkhAddress, Script());
}